

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

void crnlib::MatchFinder_ReadBlock(CMatchFinder *p)

{
  SRes SVar1;
  UInt32 UVar2;
  size_t size;
  Byte *local_18;
  
  if (p->streamEndWasReached != 0) {
    return;
  }
  if (p->result == 0) {
    do {
      local_18 = p->bufferBase + ((ulong)p->blockSize - (long)(p->buffer + (p->streamPos - p->pos)))
      ;
      if (local_18 == (Byte *)0x0) {
        return;
      }
      SVar1 = (*p->stream->Read)(p->stream,p->buffer + (p->streamPos - p->pos),(size_t *)&local_18);
      p->result = SVar1;
      if (SVar1 != 0) {
        return;
      }
      if (local_18 == (Byte *)0x0) {
        p->streamEndWasReached = 1;
        return;
      }
      UVar2 = (int)local_18 + p->streamPos;
      p->streamPos = UVar2;
    } while (UVar2 - p->pos <= p->keepSizeAfter);
  }
  return;
}

Assistant:

static void MatchFinder_ReadBlock(CMatchFinder* p) {
  if (p->streamEndWasReached || p->result != SZ_OK)
    return;
  for (;;) {
    Byte* dest = p->buffer + (p->streamPos - p->pos);
    size_t size = (p->bufferBase + p->blockSize - dest);
    if (size == 0)
      return;
    p->result = p->stream->Read(p->stream, dest, &size);
    if (p->result != SZ_OK)
      return;
    if (size == 0) {
      p->streamEndWasReached = 1;
      return;
    }
    p->streamPos += (UInt32)size;
    if (p->streamPos - p->pos > p->keepSizeAfter)
      return;
  }
}